

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O2

void compose_patch(cJSON *patches,uchar *operation,uchar *path,uchar *suffix,cJSON *value)

{
  long lVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  
  if (path != (uchar *)0x0 && (operation != (uchar *)0x0 && patches != (cJSON *)0x0)) {
    lVar1 = cJSON_CreateObject();
    if (lVar1 != 0) {
      uVar2 = cJSON_CreateString(operation);
      cJSON_AddItemToObject(lVar1,"op",uVar2);
      if (suffix == (uchar *)0x0) {
        uVar2 = cJSON_CreateString(path);
        cJSON_AddItemToObject(lVar1,"path",uVar2);
      }
      else {
        sVar3 = pointer_encoded_length(suffix);
        sVar4 = strlen((char *)path);
        __s = (char *)cJSON_malloc(sVar3 + sVar4 + 2);
        sprintf(__s,"%s/",path);
        encode_string_as_pointer((uchar *)(__s + sVar4 + 1),suffix);
        uVar2 = cJSON_CreateString(__s);
        cJSON_AddItemToObject(lVar1,"path",uVar2);
        cJSON_free(__s);
      }
      if (value != (cJSON *)0x0) {
        uVar2 = cJSON_Duplicate(value,1);
        cJSON_AddItemToObject(lVar1,"value",uVar2);
      }
      cJSON_AddItemToArray(patches,lVar1);
      return;
    }
  }
  return;
}

Assistant:

static void compose_patch(cJSON * const patches, const unsigned char * const operation, const unsigned char * const path, const unsigned char *suffix, const cJSON * const value)
{
    cJSON *patch = NULL;

    if ((patches == NULL) || (operation == NULL) || (path == NULL))
    {
        return;
    }

    patch = cJSON_CreateObject();
    if (patch == NULL)
    {
        return;
    }
    cJSON_AddItemToObject(patch, "op", cJSON_CreateString((const char*)operation));

    if (suffix == NULL)
    {
        cJSON_AddItemToObject(patch, "path", cJSON_CreateString((const char*)path));
    }
    else
    {
        size_t suffix_length = pointer_encoded_length(suffix);
        size_t path_length = strlen((const char*)path);
        unsigned char *full_path = (unsigned char*)cJSON_malloc(path_length + suffix_length + sizeof("/"));

        sprintf((char*)full_path, "%s/", (const char*)path);
        encode_string_as_pointer(full_path + path_length + 1, suffix);

        cJSON_AddItemToObject(patch, "path", cJSON_CreateString((const char*)full_path));
        cJSON_free(full_path);
    }

    if (value != NULL)
    {
        cJSON_AddItemToObject(patch, "value", cJSON_Duplicate(value, 1));
    }
    cJSON_AddItemToArray(patches, patch);
}